

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::quatd> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quatd>
          (optional<tinyusdz::value::quatd> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<tinyusdz::value::quatd> local_78;
  undefined1 local_48 [8];
  quatd value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value.real._4_4_ = interp;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<tinyusdz::value::quatd>
                      (this,(quatd *)local_48,t,value.real._4_4_);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional<tinyusdz::value::quatd,_0>
                (__return_storage_ptr__,(quatd *)local_48);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quatd>(&local_78,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional<tinyusdz::value::quatd,_0>
              (__return_storage_ptr__,&local_78);
    nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }